

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int update_traffic_key_cb
              (ptls_update_traffic_key_t *self,ptls_t *tls,int is_enc,size_t epoch,void *secret)

{
  quicly_conn_t *conn;
  char *pcVar1;
  st_quicly_handshake_space_t *psVar2;
  ulong uVar3;
  anon_struct_112_4_eef7ff01_for_ingress *paVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  ptls_context_t *ppVar8;
  ptls_cipher_suite_t *ppVar9;
  quicly_context_t *pqVar10;
  _st_quicly_conn_public_t *c;
  size_t size;
  st_quicly_application_space_t *psVar11;
  uint8_t *puVar12;
  anon_struct_216_2_55ab8ea6_for_cipher *hp_ctx;
  anon_struct_104_4_e718f752_for_egress *aead_ctx;
  char hexbuf [129];
  
  ppvVar7 = ptls_get_data_ptr(tls);
  conn = (quicly_conn_t *)*ppvVar7;
  ppVar8 = ptls_get_context(tls);
  ppVar9 = ptls_get_cipher(tls);
  iVar5 = ptls_is_server(tls);
  if (ppVar8->log_event != (ptls_log_event_t *)0x0) {
    pcVar1 = update_traffic_key_cb::log_labels[iVar5 == is_enc][epoch];
    ptls_hexdump(hexbuf,secret,ppVar9->hash->digest_size);
    (*ppVar8->log_event->cb)(ppVar8->log_event,tls,pcVar1,"%s",hexbuf);
  }
  if (epoch == 3) {
    if ((is_enc != 0) && (iVar5 = apply_remote_transport_params(conn), iVar5 != 0)) {
      return iVar5;
    }
    if ((conn->application == (st_quicly_application_space_t *)0x0) &&
       (iVar5 = setup_application_space(conn), iVar5 != 0)) {
      return iVar5;
    }
    psVar11 = conn->application;
    if (is_enc == 0) {
      paVar4 = &(psVar11->cipher).ingress;
      aead_ctx = (anon_struct_104_4_e718f752_for_egress *)(psVar11->cipher).ingress.aead;
      puVar12 = (psVar11->cipher).ingress.secret;
    }
    else {
      if ((psVar11->cipher).egress.key.aead != (ptls_aead_context_t *)0x0) {
        dispose_cipher(&(psVar11->cipher).egress.key);
        psVar11 = conn->application;
      }
      aead_ctx = &(psVar11->cipher).egress;
      paVar4 = (anon_struct_112_4_eef7ff01_for_ingress *)&(psVar11->cipher).egress;
      puVar12 = (psVar11->cipher).egress.secret;
    }
    hp_ctx = (anon_struct_216_2_55ab8ea6_for_cipher *)
             &((st_quicly_cipher_context_t *)&paVar4->header_protection)->header_protection;
    memcpy(puVar12,secret,ppVar9->hash->digest_size);
  }
  else if (epoch == 2) {
    if ((conn->handshake == (st_quicly_handshake_space_t *)0x0) &&
       (iVar5 = setup_handshake_space_and_flow(conn,2), iVar5 != 0)) {
      return iVar5;
    }
    psVar2 = conn->handshake;
    if (is_enc == 0) {
      hp_ctx = (anon_struct_216_2_55ab8ea6_for_cipher *)&(psVar2->cipher).ingress.header_protection;
      aead_ctx = (anon_struct_104_4_e718f752_for_egress *)&psVar2->cipher;
    }
    else {
      hp_ctx = (anon_struct_216_2_55ab8ea6_for_cipher *)&(psVar2->cipher).egress.header_protection;
      aead_ctx = (anon_struct_104_4_e718f752_for_egress *)&(psVar2->cipher).egress;
    }
  }
  else {
    if (epoch != 1) {
      __assert_fail("!\"logic flaw\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x103e,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if (((uint)(conn->super).local.bidi.next_stream_id & 1 ^ is_enc) != 1) {
      __assert_fail("is_enc == quicly_is_client(conn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x101b,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if ((conn->application == (st_quicly_application_space_t *)0x0) &&
       (iVar5 = setup_application_space(conn), iVar5 != 0)) {
      return iVar5;
    }
    psVar11 = conn->application;
    if (is_enc == 0) {
      hp_ctx = &psVar11->cipher;
      aead_ctx = (anon_struct_104_4_e718f752_for_egress *)((psVar11->cipher).ingress.aead + 1);
    }
    else {
      aead_ctx = &(psVar11->cipher).egress;
      hp_ctx = (anon_struct_216_2_55ab8ea6_for_cipher *)
               &(psVar11->cipher).egress.key.header_protection;
    }
  }
  iVar5 = setup_cipher(conn,epoch,is_enc,(ptls_cipher_context_t **)hp_ctx,
                       (ptls_aead_context_t **)aead_ctx,ppVar9->aead,ppVar9->hash,secret);
  if ((iVar5 == 0) && (iVar5 = 0, is_enc != 0 && epoch == 3)) {
    conn->application->one_rtt_writable = 1;
    open_blocked_streams(conn,1);
    open_blocked_streams(conn,0);
    pqVar10 = (conn->super).ctx;
    if ((((conn->super).local.bidi.next_stream_id & 1) != 0) &&
       (pqVar10->generate_resumption_token != (quicly_generate_resumption_token_t *)0x0)) {
      quicly_send_resumption_token(conn);
      pqVar10 = (conn->super).ctx;
    }
    if (pqVar10->cid_encryptor == (quicly_cid_encryptor_t *)0x0) {
      size = 1;
    }
    else {
      uVar3 = (conn->super).remote.transport_params.active_connection_id_limit;
      size = 4;
      if (uVar3 < 4) {
        size = uVar3;
      }
    }
    iVar6 = quicly_local_cid_set_size(&(conn->super).local.cid_set,size);
    iVar5 = 0;
    if (iVar6 != 0) {
      puVar12 = &(conn->egress).pending_flows;
      *puVar12 = *puVar12 | 0x80;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int update_traffic_key_cb(ptls_update_traffic_key_t *self, ptls_t *tls, int is_enc, size_t epoch, const void *secret)
{
    quicly_conn_t *conn = *ptls_get_data_ptr(tls);
    ptls_context_t *tlsctx = ptls_get_context(tls);
    ptls_cipher_suite_t *cipher = ptls_get_cipher(tls);
    ptls_cipher_context_t **hp_slot;
    ptls_aead_context_t **aead_slot;
    int ret;
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    const char *log_label = log_labels[ptls_is_server(tls) == is_enc][epoch];

    QUICLY_PROBE(CRYPTO_UPDATE_SECRET, conn, conn->stash.now, is_enc, epoch, log_label,
                 QUICLY_PROBE_HEXDUMP(secret, cipher->hash->digest_size));

    if (tlsctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret, cipher->hash->digest_size);
        tlsctx->log_event->cb(tlsctx->log_event, tls, log_label, "%s", hexbuf);
    }

#define SELECT_CIPHER_CONTEXT(p)                                                                                                   \
    do {                                                                                                                           \
        hp_slot = &(p)->header_protection;                                                                                         \
        aead_slot = &(p)->aead;                                                                                                    \
    } while (0)

    switch (epoch) {
    case QUICLY_EPOCH_0RTT:
        assert(is_enc == quicly_is_client(conn));
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        if (is_enc) {
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.zero_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[1];
        }
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (conn->handshake == NULL && (ret = setup_handshake_space_and_flow(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
            return ret;
        SELECT_CIPHER_CONTEXT(is_enc ? &conn->handshake->cipher.egress : &conn->handshake->cipher.ingress);
        break;
    case QUICLY_EPOCH_1RTT: {
        if (is_enc)
            if ((ret = apply_remote_transport_params(conn)) != 0)
                return ret;
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        uint8_t *secret_store;
        if (is_enc) {
            if (conn->application->cipher.egress.key.aead != NULL)
                dispose_cipher(&conn->application->cipher.egress.key);
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
            secret_store = conn->application->cipher.egress.secret;
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.one_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[0];
            secret_store = conn->application->cipher.ingress.secret;
        }
        memcpy(secret_store, secret, cipher->hash->digest_size);
    } break;
    default:
        assert(!"logic flaw");
        break;
    }

#undef SELECT_CIPHER_CONTEXT

    if ((ret = setup_cipher(conn, epoch, is_enc, hp_slot, aead_slot, cipher->aead, cipher->hash, secret)) != 0)
        return ret;

    if (epoch == QUICLY_EPOCH_1RTT && is_enc) {
        /* update states now that we have 1-RTT write key */
        conn->application->one_rtt_writable = 1;
        open_blocked_streams(conn, 1);
        open_blocked_streams(conn, 0);
        /* send the first resumption token using the 0.5 RTT window */
        if (!quicly_is_client(conn) && conn->super.ctx->generate_resumption_token != NULL) {
            ret = quicly_send_resumption_token(conn);
            assert(ret == 0);
        }

        /* schedule NEW_CONNECTION_IDs */
        size_t size = local_cid_size(conn);
        if (quicly_local_cid_set_size(&conn->super.local.cid_set, size))
            conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;
    }

    return 0;
}